

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementSlotI1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot regSlot,int32 slotId,
          ProfileId profileId)

{
  undefined1 *puVar1;
  uint uVar2;
  code *pcVar3;
  OpCode OVar4;
  bool bVar5;
  uint uVar6;
  RegSlot reg;
  DWORD DVar7;
  uint uVar8;
  uint uVar9;
  JITTimeFunctionBody *pJVar10;
  SymOpnd *pSVar11;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  undefined4 *puVar14;
  ByteCodeUsesInstr *pBVar15;
  PropertySym *pPVar16;
  StackSym *sym;
  IntConstOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *src2Opnd;
  Func *func;
  StackSym *pSVar17;
  SymID local_3c;
  bool local_31 [8];
  bool isLdSlotThatWasNotProfiled;
  
  pJVar10 = Func::GetJITFunctionBody(this->m_func);
  local_3c = JITTimeFunctionBody::GetLocalClosureReg(pJVar10);
  local_31[0] = false;
  pSVar17 = this->m_func->m_localClosureSym;
  bVar5 = this->m_paramScopeDone;
  pJVar10 = Func::GetJITFunctionBody(this->m_func);
  if (bVar5 == true) {
    uVar6 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar10);
  }
  else {
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
  }
  OVar4 = newOpcode;
  switch(newOpcode) {
  case LdParamSlot:
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
    pSVar17 = this->m_func->m_paramClosureSym;
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
    break;
  case ProfiledLdParamSlot:
  case LdInnerObjSlot:
  case ProfiledLdInnerObjSlot:
  case LdObjSlot:
  case ProfiledLdObjSlot:
  case ProfiledLdLocalObjSlot:
  case ProfiledLdParamObjSlot:
  case LdEnvObjSlot:
  case ProfiledLdEnvObjSlot:
  case LdModuleSlot:
  case ProfiledLdModuleSlot:
  case StEnvSlotChkUndecl:
  case StInnerSlotChkUndecl:
  case StObjSlot:
  case StInnerObjSlot:
switchD_004953d1_caseD_135:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xf47,"(0)","0");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar14 = 0;
    pIVar13 = (Instr *)0x0;
    goto LAB_00495c13;
  case LdParamObjSlot:
    pSVar17 = this->m_func->m_paramClosureSym;
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
  case LdLocalObjSlot:
    if ((pSVar17->field_0x19 & 0x20) != 0) {
      pBVar15 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar15,(pSVar17->super_Sym).m_id);
      AddInstr(this,&pBVar15->super_Instr,offset);
    }
    DVar7 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pSVar11 = BuildFieldOpnd(this,LdLocalObjSlot,local_3c,DVar7 >> 3,0xffffffff,
                             PropertyKindSlotArray,0xffffffff);
    pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    pPVar16 = PropertySym::New(pRVar12->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                               this->m_func);
    pSVar11 = IR::SymOpnd::New(&pPVar16->super_Sym,TyVar,this->m_func);
    goto LAB_00495bb5;
  case StParamSlot:
  case StParamSlotChkUndecl:
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
    pSVar17 = this->m_func->m_paramClosureSym;
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
    OVar4 = StLocalSlotChkUndecl;
    if (newOpcode == StParamSlot) {
      OVar4 = StLocalSlot;
    }
    goto LAB_004957a1;
  case StLocalSlotChkUndecl:
LAB_004957a1:
    uVar8 = Func::GetSourceContextId(this->m_func);
    uVar9 = Func::GetLocalFunctionId(this->m_func);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ClosureRangeCheckPhase,uVar8,uVar9);
    if ((uVar6 + 2 <= (uint)slotId) && (!bVar5)) goto LAB_00495c4d;
    if ((pSVar17->field_0x19 & 0x20) != 0) {
      pBVar15 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar15,(pSVar17->super_Sym).m_id);
      AddInstr(this,&pBVar15->super_Instr,offset);
    }
    if (this->m_func->stackClosure == true) {
      pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
      pSVar11 = BuildFieldOpnd(this,LdSlotArr,(pSVar17->super_Sym).m_id,0,0xffffffff,
                               PropertyKindSlotArray,0xffffffff);
      pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
      AddInstr(this,pIVar13,offset);
      local_3c = (pRVar12->m_sym->super_Sym).m_id;
      bVar5 = IsLoopBody(this);
      if (bVar5) {
        BuildFieldOpnd(this,LdSlotArr,(pSVar17->super_Sym).m_id,slotId,0xffffffff,
                       PropertyKindSlotArray,0xffffffff);
      }
    }
    else {
      bVar5 = IsLoopBody(this);
      if (bVar5) {
        EnsureLoopBodyLoadSlot(this,local_3c,false);
      }
    }
    pPVar16 = PropertySym::FindOrCreate
                        (local_3c,slotId,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
    pSVar11 = IR::SymOpnd::New(&pPVar16->super_Sym,TyVar,this->m_func);
    pRVar12 = BuildSrcOpnd(this,regSlot,TyVar);
    pIVar13 = IR::Instr::New((OVar4 != StLocalSlot) + StSlot,&pSVar11->super_Opnd,
                             &pRVar12->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    if (OVar4 != StLocalSlot) {
      IR::Instr::SetSrc2(pIVar13,&pSVar11->super_Opnd);
    }
    goto LAB_00495c13;
  case StParamObjSlot:
  case StParamObjSlotChkUndecl:
    pSVar17 = this->m_func->m_paramClosureSym;
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
    newOpcode = (ushort)(newOpcode != StParamObjSlot) * 2 + StLocalObjSlot;
  case StLocalObjSlot:
  case StLocalObjSlotChkUndecl:
    if ((pSVar17->field_0x19 & 0x20) != 0) {
      pBVar15 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar15,(pSVar17->super_Sym).m_id);
      AddInstr(this,&pBVar15->super_Instr,offset);
    }
    pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
    DVar7 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pSVar11 = BuildFieldOpnd(this,LdSlotArr,local_3c,DVar7 >> 3,0xffffffff,PropertyKindSlotArray,
                             0xffffffff);
    pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    pPVar16 = PropertySym::New(pRVar12->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                               this->m_func);
    pSVar11 = IR::SymOpnd::New(&pPVar16->super_Sym,TyVar,this->m_func);
    pRVar12 = BuildSrcOpnd(this,regSlot,TyVar);
    pIVar13 = IR::Instr::New((newOpcode != StLocalObjSlot) + StSlot,&pSVar11->super_Opnd,
                             &pRVar12->super_Opnd,this->m_func);
    if (newOpcode != StLocalObjSlot) {
      IR::Instr::SetSrc2(pIVar13,&pSVar11->super_Opnd);
    }
    goto LAB_00495c05;
  default:
    sym = (StackSym *)0x0;
    if (newOpcode - 0xd6 < 2) {
LAB_00495965:
      src1Opnd = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,true);
      pRVar12 = (RegOpnd *)GetEnvironmentOperand(this,offset);
      dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,false);
      func = this->m_func;
      if (sym != (StackSym *)0x0) {
        dstOpnd_00 = IR::RegOpnd::New(TyVar,func);
        src2Opnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
        pIVar13 = IR::Instr::New(NewScFuncData,&dstOpnd_00->super_Opnd,(Opnd *)pRVar12,
                                 &src2Opnd->super_Opnd,this->m_func);
        AddInstr(this,pIVar13,offset);
        func = this->m_func;
        pRVar12 = dstOpnd_00;
      }
      pIVar13 = IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                               &pRVar12->super_Opnd,func);
      uVar2 = *(uint *)&dstOpnd->m_sym->field_0x18;
      if ((uVar2 & 1) != 0) {
        *(uint *)&dstOpnd->m_sym->field_0x18 = uVar2 | 4;
        puVar1 = &dstOpnd->m_sym->field_0x18;
        *(uint *)puVar1 = *(uint *)puVar1 | 2;
      }
      AddInstr(this,pIVar13,offset);
      return;
    }
    if (newOpcode != LdLocalSlot) {
      if (newOpcode != StLocalSlot) {
        if (newOpcode == NewStackScFunc) {
          sym = EnsureStackFuncPtrSym(this);
          newOpcode = NewScFunc;
          goto LAB_00495965;
        }
        if (newOpcode != LdEnvObj) {
          if (newOpcode != LdEnvObj_ReuseLoc) goto switchD_004953d1_caseD_135;
          sym = (StackSym *)&DAT_00000001;
        }
        reg = GetEnvReg(this);
        pSVar11 = BuildFieldOpnd(this,LdSlotArr,reg,slotId,0xffffffff,PropertyKindSlotArray,
                                 0xffffffff);
        pRVar12 = BuildDstOpnd(this,regSlot,TyVar,false,SUB81(sym,0));
        pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
        AddInstr(this,pIVar13,offset);
        Func::AddFrameDisplayCheck(this->m_func->topFunc,pSVar11,0xffffffff);
        goto LAB_00495c13;
      }
      goto LAB_004957a1;
    }
  }
  uVar8 = Func::GetSourceContextId(this->m_func);
  uVar9 = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ClosureRangeCheckPhase,uVar8,uVar9);
  if ((uVar6 + 2 <= (uint)slotId) && (!bVar5)) {
LAB_00495c4d:
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  if ((pSVar17->field_0x19 & 0x20) != 0) {
    pBVar15 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
    IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar15,(pSVar17->super_Sym).m_id);
    AddInstr(this,&pBVar15->super_Instr,offset);
  }
  if (this->m_func->stackClosure == true) {
    pSVar11 = BuildFieldOpnd(this,LdSlotArr,(pSVar17->super_Sym).m_id,0,0xffffffff,
                             PropertyKindSlotArray,0xffffffff);
    pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    local_3c = (pRVar12->m_sym->super_Sym).m_id;
    bVar5 = IsLoopBody(this);
    if (bVar5) {
      BuildFieldOpnd(this,LdSlotArr,(pSVar17->super_Sym).m_id,slotId,0xffffffff,
                     PropertyKindSlotArray,0xffffffff);
    }
  }
  else {
    bVar5 = IsLoopBody(this);
    if (bVar5) {
      EnsureLoopBodyLoadSlot(this,local_3c,false);
    }
  }
  pPVar16 = PropertySym::FindOrCreate
                      (local_3c,slotId,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
  pSVar11 = IR::SymOpnd::New(&pPVar16->super_Sym,TyVar,this->m_func);
LAB_00495bb5:
  pRVar12 = BuildDstOpnd(this,regSlot,TyVar,false,false);
  if ((profileId == 0xffff) ||
     (pIVar13 = BuildProfiledSlotLoad(this,LdSlot,pRVar12,pSVar11,profileId,local_31),
     pIVar13 == (Instr *)0x0)) {
    pIVar13 = IR::Instr::New(LdSlot,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
  }
LAB_00495c05:
  AddInstr(this,pIVar13,offset);
LAB_00495c13:
  if ((local_31[0] == true) && (bVar5 = DoBailOnNoProfile(this), bVar5)) {
    InsertBailOnNoProfile(this,pIVar13);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementSlotI1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot regSlot,
                              int32 slotId, Js::ProfileId profileId)
{
    IR::RegOpnd *regOpnd;
    IR::SymOpnd *fieldOpnd;
    IR::Instr   *instr = nullptr;
    IR::ByteCodeUsesInstr *byteCodeUse;
    PropertySym *fieldSym = nullptr;
    StackSym *   stackFuncPtrSym = nullptr;
    SymID        symID = m_func->GetJITFunctionBody()->GetLocalClosureReg();
    bool isLdSlotThatWasNotProfiled = false;
    bool reuseLoc = false;
    StackSym* closureSym = m_func->GetLocalClosureSym();

    uint scopeSlotSize = this->IsParamScopeDone() ? m_func->GetJITFunctionBody()->GetScopeSlotArraySize() : m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();

    switch (newOpcode)
    {
        case Js::OpCode::LdParamSlot:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            // Fall through

        case Js::OpCode::LdLocalSlot:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            // Read the scope slot pointer back using the stack closure sym.
            newOpcode = Js::OpCode::LdSlot;
            if (m_func->DoStackFrameDisplay())
            {
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else if (IsLoopBody())
            {
                this->EnsureLoopBodyLoadSlot(symID);
            }

            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(Js::OpCode::LdSlot, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);

            break;

        case Js::OpCode::LdParamObjSlot:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = Js::OpCode::LdLocalObjSlot;
            // Fall through

        case Js::OpCode::LdLocalObjSlot:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            fieldOpnd = this->BuildFieldOpnd(newOpcode, symID, (Js::DynamicObject::GetOffsetOfAuxSlots()) / sizeof(Js::Var), (Js::PropertyIdIndexType) - 1, PropertyKindSlotArray);
            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            newOpcode = Js::OpCode::LdSlot;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(newOpcode, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::StParamSlot:
        case Js::OpCode::StParamSlotChkUndecl:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamSlot ? Js::OpCode::StLocalSlot : Js::OpCode::StLocalSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalSlot:
        case Js::OpCode::StLocalSlotChkUndecl:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            newOpcode = newOpcode == Js::OpCode::StLocalSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            if (m_func->DoStackFrameDisplay())
            {
                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else
            {
                if (IsLoopBody())
                {
                    this->EnsureLoopBodyLoadSlot(symID);
                }
            }
            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);
            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            this->AddInstr(instr, offset);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                instr->SetSrc2(fieldOpnd);
            }

            break;

        case Js::OpCode::StParamObjSlot:
        case Js::OpCode::StParamObjSlotChkUndecl:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamObjSlot ? Js::OpCode::StLocalObjSlot : Js::OpCode::StLocalObjSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalObjSlot:
        case Js::OpCode::StLocalObjSlotChkUndecl:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, symID, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            newOpcode = newOpcode == Js::OpCode::StLocalObjSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
                instr->SetSrc2(fieldOpnd);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::LdEnvObj_ReuseLoc:
            reuseLoc = true;
            // fall through
        case Js::OpCode::LdEnvObj:
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, this->GetEnvReg(), slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            m_func->GetTopFunc()->AddFrameDisplayCheck(fieldOpnd);
            break;

        case Js::OpCode::NewStackScFunc:
            stackFuncPtrSym = this->EnsureStackFuncPtrSym();
            newOpcode = Js::OpCode::NewScFunc;
            // fall through
        case Js::OpCode::NewScFunc:
            goto NewScFuncCommon;

        case Js::OpCode::NewScGenFunc:
            newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
            {
                IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);

                IR::Opnd *environmentOpnd = GetEnvironmentOperand(offset);
                regOpnd = this->BuildDstOpnd(regSlot);
                if (stackFuncPtrSym)
                {
                    IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
                    instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, 
                                           IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
                    this->AddInstr(instr, offset);
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
                }
                else
                {
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
                }
                if (regOpnd->m_sym->m_isSingleDef)
                {
                    regOpnd->m_sym->m_isSafeThis = true;
                    regOpnd->m_sym->m_isNotNumber = true;
                }
                this->AddInstr(instr, offset);
                return;
            }

        default:
            Assert(0);
    }


    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}